

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderStructTests.cpp
# Opt level: O3

int __thiscall deqp::LocalStructTests::init(LocalStructTests *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  Context *pCVar2;
  int extraout_EAX;
  LineStream *pLVar3;
  ShaderStructCase *pSVar4;
  undefined1 local_1d0 [384];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, vec3(0.0), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b = ${COORDS}.yzw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"basic_vertex","Basic struct usage",GVar1,true,false,
                            init()::Eval_basic::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, vec3(0.0), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b = ${COORDS}.yzw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"basic_fragment","Basic struct usage",GVar1,false,false,
                            init()::Eval_basic::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b = T(ui_zero, ${COORDS}.yz);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_vertex","Nested struct",GVar1,true,false,
                            init()::Eval_nested::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b = T(ui_zero, ${COORDS}.yz);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_fragment","Nested struct",GVar1,false,false,
                            init()::Eval_nested::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.a = ${COORDS}.w;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.c = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b[0] = ${COORDS}.z;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b[1] = ${COORDS}.y;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b[2] = ${COORDS}.x;");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b[0], s.b[1], s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"array_member_vertex","Struct with array member",GVar1,true,false
                            ,init()::Eval_array_member::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.a = ${COORDS}.w;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.c = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b[0] = ${COORDS}.z;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b[1] = ${COORDS}.y;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b[2] = ${COORDS}.x;");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b[0], s.b[1], s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"array_member_fragment","Struct with array member",GVar1,false,
                            false,init()::Eval_array_member::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.a = ${COORDS}.w;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.c = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b[0] = ${COORDS}.z;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b[1] = ${COORDS}.y;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b[2] = ${COORDS}.x;");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"array_member_dynamic_index_vertex",
                            "Struct with array member, dynamic indexing",GVar1,true,false,
                            init()::Eval_array_member_dynamic_index::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.a = ${COORDS}.w;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.c = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b[0] = ${COORDS}.z;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b[1] = ${COORDS}.y;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b[2] = ${COORDS}.x;");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"array_member_dynamic_index_fragment",
                            "Struct with array member, dynamic indexing",GVar1,false,false,
                            init()::Eval_array_member_dynamic_index::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a = ${COORDS}.y;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);")
  ;
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"struct_array_vertex","Struct array",GVar1,true,false,
                            init()::Eval_struct_array::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a = ${COORDS}.y;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);")
  ;
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"struct_array_fragment","Struct array",GVar1,false,false,
                            init()::Eval_struct_array::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a = ${COORDS}.y;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    ${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"struct_array_dynamic_index_vertex",
                            "Struct array with dynamic indexing",GVar1,true,false,
                            init()::Eval_struct_array_dynamic_index::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a = ${COORDS}.y;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    ${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"struct_array_dynamic_index_fragment",
                            "Struct array with dynamic indexing",GVar1,false,false,
                            init()::Eval_struct_array_dynamic_index::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[0]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].a         = ${COORDS}.x;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].a    = uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[0] = ${COORDS}.xy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[1] = ${COORDS}.zw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].a    = uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[0] = ${COORDS}.zw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[1] = ${COORDS}.xy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].a    = uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[0] = ${COORDS}.xz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[1] = ${COORDS}.yw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].c         = ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[1]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a         = ${COORDS}.w;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].a    = uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[0] = ${COORDS}.xx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[1] = ${COORDS}.yy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].a    = uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].a    = uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].c         = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w + w) * 0.333"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(r, g, b, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_struct_array_vertex","Nested struct array",GVar1,true,
                            false,init()::Eval_nested_struct_array::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[0]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].a         = ${COORDS}.x;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].a    = uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[0] = ${COORDS}.xy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[1] = ${COORDS}.zw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].a    = uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[0] = ${COORDS}.zw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[1] = ${COORDS}.xy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].a    = uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[0] = ${COORDS}.xz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[1] = ${COORDS}.yw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].c         = ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[1]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a         = ${COORDS}.w;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].a    = uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[0] = ${COORDS}.xx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[1] = ${COORDS}.yy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].a    = uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].a    = uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].c         = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w + w) * 0.333"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(r, g, b, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_struct_array_fragment","Nested struct array",GVar1,false,
                            false,init()::Eval_nested_struct_array::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[0]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].a         = ${COORDS}.x;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].a    = uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[0] = ${COORDS}.xy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[1] = ${COORDS}.zw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].a    = uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[0] = ${COORDS}.zw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[1] = ${COORDS}.xy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].a    = uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[0] = ${COORDS}.xz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[1] = ${COORDS}.yw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].c         = ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[1]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a         = ${COORDS}.w;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].a    = uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[0] = ${COORDS}.xx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[1] = ${COORDS}.yy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].a    = uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].a    = uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].c         = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float r = (s[0].b[ui_one].b[ui_one-1].x + s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a * s[ui_one].b[2].a; // x * 0.25 * 4"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float b = (s[ui_zero].b[ui_one+1].b[1].y + s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w + w + w) * 0.333"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(r, g, b, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_struct_array_dynamic_index_vertex",
                            "Nested struct array with dynamic indexing",GVar1,true,false,
                            init()::Eval_nested_struct_array_dynamic_index::eval(deqp::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[0]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].a         = ${COORDS}.x;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].a    = uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[0] = ${COORDS}.xy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[1] = ${COORDS}.zw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].a    = uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[0] = ${COORDS}.zw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[1] = ${COORDS}.xy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].a    = uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[0] = ${COORDS}.xz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[1] = ${COORDS}.yw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].c         = ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[1]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a         = ${COORDS}.w;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].a    = uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[0] = ${COORDS}.xx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[1] = ${COORDS}.yy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].a    = uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].a    = uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].c         = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float r = (s[0].b[ui_one].b[ui_one-1].x + s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a * s[ui_one].b[2].a; // x * 0.25 * 4"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float b = (s[ui_zero].b[ui_one+1].b[1].y + s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w + w + w) * 0.333"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(r, g, b, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_struct_array_dynamic_index_fragment",
                            "Nested struct array with dynamic indexing",GVar1,false,false,
                            init()::Eval_nested_struct_array_dynamic_index::eval(deqp::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"mediump vec4 myFunc (S s)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    return vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, vec3(0.0), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b = ${COORDS}.yzw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = myFunc(s);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"parameter_vertex","Struct as a function parameter",GVar1,true,
                            false,init()::Eval_parameter::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"mediump vec4 myFunc (S s)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    return vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, vec3(0.0), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b = ${COORDS}.yzw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = myFunc(s);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"parameter_fragment","Struct as a function parameter",GVar1,false
                            ,false,init()::Eval_parameter::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"mediump vec4 myFunc (S s)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    return vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b = T(ui_zero, ${COORDS}.yz);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = myFunc(s);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"parameter_nested_vertex","Nested struct as a function parameter"
                            ,GVar1,true,false,
                            init()::Eval_parameter_nested::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"mediump vec4 myFunc (S s)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    return vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b = T(ui_zero, ${COORDS}.yz);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = myFunc(s);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"parameter_nested_fragment",
                            "Nested struct as a function parameter",GVar1,false,false,
                            init()::Eval_parameter_nested::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"S myFunc (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, vec3(0.0), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b = ${COORDS}.yzw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    return s;");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = myFunc();");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"return_vertex","Struct as a return value",GVar1,true,false,
                            init()::Eval_return::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"S myFunc (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, vec3(0.0), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b = ${COORDS}.yzw;");
  pLVar3 = LineStream::operator<<(pLVar3,"    return s;");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = myFunc();");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"return_fragment","Struct as a return value",GVar1,false,false,
                            init()::Eval_return::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"S myFunc (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b = T(ui_zero, ${COORDS}.yz);");
  pLVar3 = LineStream::operator<<(pLVar3,"    return s;");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = myFunc();");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"return_nested_vertex","Nested struct",GVar1,true,false,
                            init()::Eval_return_nested::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"S myFunc (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s.b = T(ui_zero, ${COORDS}.yz);");
  pLVar3 = LineStream::operator<<(pLVar3,"    return s;");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = myFunc();");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"return_nested_fragment","Nested struct",GVar1,false,false,
                            init()::Eval_return_nested::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    if (uf_one > 0.0)");
  pLVar3 = LineStream::operator<<(pLVar3,"        s = S(${COORDS}.w, ${COORDS}.zyx, ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.xy, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"conditional_assignment_vertex","Conditional struct assignment",
                            GVar1,true,false,
                            init()::Eval_conditional_assignment::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    if (uf_one > 0.0)");
  pLVar3 = LineStream::operator<<(pLVar3,"        s = S(${COORDS}.w, ${COORDS}.zyx, ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.xy, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"conditional_assignment_fragment","Conditional struct assignment"
                            ,GVar1,false,false,
                            init()::Eval_conditional_assignment::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < 3; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        if (i == 1)");
  pLVar3 = LineStream::operator<<(pLVar3,"            s = S(${COORDS}.w, ${COORDS}.zyx, ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.xy, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_assignment_vertex","Struct assignment in loop",GVar1,true,
                            false,init()::Eval_loop_assignment::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < 3; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        if (i == 1)");
  pLVar3 = LineStream::operator<<(pLVar3,"            s = S(${COORDS}.w, ${COORDS}.zyx, ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.xy, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_assignment_fragment","Struct assignment in loop",GVar1,
                            false,false,init()::Eval_loop_assignment::eval(deqp::ShaderEvalContext__
                            ,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < ui_three; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        if (i == ui_one)");
  pLVar3 = LineStream::operator<<(pLVar3,"            s = S(${COORDS}.w, ${COORDS}.zyx, ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.xy, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_assignment_vertex","Struct assignment in loop",
                            GVar1,true,false,
                            init()::Eval_dynamic_loop_assignment::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < ui_three; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        if (i == ui_one)");
  pLVar3 = LineStream::operator<<(pLVar3,"            s = S(${COORDS}.w, ${COORDS}.zyx, ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.xy, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_assignment_fragment","Struct assignment in loop",
                            GVar1,false,false,
                            init()::Eval_dynamic_loop_assignment::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    S s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    if (uf_one > 0.0)");
  pLVar3 = LineStream::operator<<(pLVar3,"        s.b = T(ui_zero, ${COORDS}.zw);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.b, s.c - s.b.a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_conditional_assignment_vertex",
                            "Conditional assignment of nested struct",GVar1,true,false,
                            init()::Eval_nested_conditional_assignment::eval(deqp::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    S s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    if (uf_one > 0.0)");
  pLVar3 = LineStream::operator<<(pLVar3,"        s.b = T(ui_zero, ${COORDS}.zw);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.b, s.c - s.b.a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_conditional_assignment_fragment",
                            "Conditional assignment of nested struct",GVar1,false,false,
                            init()::Eval_nested_conditional_assignment::eval(deqp::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    S s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < 3; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        if (i == 1)");
  pLVar3 = LineStream::operator<<(pLVar3,"            s.b = T(ui_zero, ${COORDS}.zw);");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.b, s.c - s.b.a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_loop_assignment_vertex",
                            "Nested struct assignment in loop",GVar1,true,false,
                            init()::Eval_nested_loop_assignment::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    S s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < 3; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        if (i == 1)");
  pLVar3 = LineStream::operator<<(pLVar3,"            s.b = T(ui_zero, ${COORDS}.zw);");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.b, s.c - s.b.a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_loop_assignment_fragment",
                            "Nested struct assignment in loop",GVar1,false,false,
                            init()::Eval_nested_loop_assignment::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    S s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < ui_three; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        if (i == ui_one)");
  pLVar3 = LineStream::operator<<(pLVar3,"            s.b = T(ui_zero, ${COORDS}.zw);");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.b, s.c - s.b.a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_dynamic_loop_assignment_vertex",
                            "Nested struct assignment in dynamic loop",GVar1,true,false,
                            init()::Eval_nested_dynamic_loop_assignment::eval(deqp::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    S s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < ui_three; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        if (i == ui_one)");
  pLVar3 = LineStream::operator<<(pLVar3,"            s.b = T(ui_zero, ${COORDS}.zw);");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.b, s.c - s.b.a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_dynamic_loop_assignment_fragment",
                            "Nested struct assignment in dynamic loop",GVar1,false,false,
                            init()::Eval_nested_dynamic_loop_assignment::eval(deqp::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a = ${COORDS}.y;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b = -ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float rgb[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int alpha = 0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < 3; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        rgb[i] = s[2-i].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        alpha += s[i].b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_struct_array_vertex","Struct array usage in loop",GVar1,
                            true,false,
                            init()::Eval_loop_struct_array::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a = ${COORDS}.y;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b = -ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float rgb[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int alpha = 0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < 3; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        rgb[i] = s[2-i].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        alpha += s[i].b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_struct_array_fragment","Struct array usage in loop",GVar1,
                            false,false,
                            init()::Eval_loop_struct_array::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[0]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].a         = ${COORDS}.x;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].a    = uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[0] = ${COORDS}.yx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[1] = ${COORDS}.zx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].a    = uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[0] = ${COORDS}.yy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[1] = ${COORDS}.wy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].a    = uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[0] = ${COORDS}.zx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[1] = ${COORDS}.zy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].c         = ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[1]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a         = ${COORDS}.w;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].a    = uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[0] = ${COORDS}.zx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[1] = ${COORDS}.zy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].a    = uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].a    = uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].c         = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float r = 0.0; // (x*3 + y*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float g = 0.0; // (y*3 + z*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float b = 0.0; // (z*3 + w*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float a = 1.0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < 2; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        for (int j = 0; j < 3; j++)");
  pLVar3 = LineStream::operator<<(pLVar3,"        {");
  pLVar3 = LineStream::operator<<(pLVar3,"            r += s[0].b[j].b[i].y;");
  pLVar3 = LineStream::operator<<(pLVar3,"            g += s[i].b[j].b[0].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            b += s[i].b[j].b[1].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            a *= s[i].b[j].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        }");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_nested_struct_array_vertex",
                            "Nested struct array usage in loop",GVar1,true,false,
                            init()::Eval_loop_nested_struct_array::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[0]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].a         = ${COORDS}.x;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].a    = uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[0] = ${COORDS}.yx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[1] = ${COORDS}.zx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].a    = uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[0] = ${COORDS}.yy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[1] = ${COORDS}.wy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].a    = uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[0] = ${COORDS}.zx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[1] = ${COORDS}.zy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].c         = ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[1]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a         = ${COORDS}.w;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].a    = uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[0] = ${COORDS}.zx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[1] = ${COORDS}.zy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].a    = uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].a    = uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].c         = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float r = 0.0; // (x*3 + y*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float g = 0.0; // (y*3 + z*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float b = 0.0; // (z*3 + w*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float a = 1.0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < 2; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        for (int j = 0; j < 3; j++)");
  pLVar3 = LineStream::operator<<(pLVar3,"        {");
  pLVar3 = LineStream::operator<<(pLVar3,"            r += s[0].b[j].b[i].y;");
  pLVar3 = LineStream::operator<<(pLVar3,"            g += s[i].b[j].b[0].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            b += s[i].b[j].b[1].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            a *= s[i].b[j].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        }");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_nested_struct_array_fragment",
                            "Nested struct array usage in loop",GVar1,false,false,
                            init()::Eval_loop_nested_struct_array::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a = ${COORDS}.y;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b = -ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float rgb[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int alpha = 0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < ui_three; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        rgb[i] = s[2-i].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        alpha += s[i].b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_struct_array_vertex",
                            "Struct array usage in dynamic loop",GVar1,true,false,
                            init()::Eval_dynamic_loop_struct_array::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0] = S(${COORDS}.x, ui_zero);");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a = ${COORDS}.y;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b = -ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[2] = S(${COORDS}.z, ui_two);");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float rgb[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int alpha = 0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < ui_three; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        rgb[i] = s[2-i].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        alpha += s[i].b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_struct_array_fragment",
                            "Struct array usage in dynamic loop",GVar1,false,false,
                            init()::Eval_dynamic_loop_struct_array::eval(deqp::ShaderEvalContext__,
                            (SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[0]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].a         = ${COORDS}.x;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].a    = uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[0] = ${COORDS}.yx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[1] = ${COORDS}.zx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].a    = uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[0] = ${COORDS}.yy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[1] = ${COORDS}.wy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].a    = uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[0] = ${COORDS}.zx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[1] = ${COORDS}.zy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].c         = ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[1]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a         = ${COORDS}.w;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].a    = uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[0] = ${COORDS}.zx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[1] = ${COORDS}.zy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].a    = uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].a    = uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].c         = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float r = 0.0; // (x*3 + y*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float g = 0.0; // (y*3 + z*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float b = 0.0; // (z*3 + w*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float a = 1.0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < ui_two; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        for (int j = 0; j < ui_three; j++)");
  pLVar3 = LineStream::operator<<(pLVar3,"        {");
  pLVar3 = LineStream::operator<<(pLVar3,"            r += s[0].b[j].b[i].y;");
  pLVar3 = LineStream::operator<<(pLVar3,"            g += s[i].b[j].b[0].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            b += s[i].b[j].b[1].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            a *= s[i].b[j].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        }");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_nested_struct_array_vertex",
                            "Nested struct array usage in dynamic loop",GVar1,true,false,
                            init()::Eval_dynamic_loop_nested_struct_array::eval(deqp::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  local_50._M_p = (pointer)&local_40;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[0]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].a         = ${COORDS}.x;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].a    = uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[0] = ${COORDS}.yx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[0].b[1] = ${COORDS}.zx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].a    = uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[0] = ${COORDS}.yy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[1].b[1] = ${COORDS}.wy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].a    = uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[0] = ${COORDS}.zx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].b[2].b[1] = ${COORDS}.zy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[0].c         = ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    // S[1]");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].a         = ${COORDS}.w;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].a    = uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[0] = ${COORDS}.zx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[0].b[1] = ${COORDS}.zy;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].a    = uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[0] = ${COORDS}.zz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[1].b[1] = ${COORDS}.ww;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].a    = uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[0] = ${COORDS}.yx;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].b[2].b[1] = ${COORDS}.wz;");
  pLVar3 = LineStream::operator<<(pLVar3,"    s[1].c         = ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float r = 0.0; // (x*3 + y*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float g = 0.0; // (y*3 + z*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float b = 0.0; // (z*3 + w*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float a = 1.0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < ui_two; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        for (int j = 0; j < ui_three; j++)");
  pLVar3 = LineStream::operator<<(pLVar3,"        {");
  pLVar3 = LineStream::operator<<(pLVar3,"            r += s[0].b[j].b[i].y;");
  pLVar3 = LineStream::operator<<(pLVar3,"            g += s[i].b[j].b[0].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            b += s[i].b[j].b[1].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            a *= s[i].b[j].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        }");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_nested_struct_array_fragment",
                            "Nested struct array usage in dynamic loop",GVar1,false,false,
                            init()::Eval_dynamic_loop_nested_struct_array::eval(deqp::
                            ShaderEvalContext__,(SetupUniformsFunc)0x0,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  return extraout_EAX;
}

Assistant:

void LocalStructTests::init(void)
{
#define LOCAL_STRUCT_CASE(NAME, DESCRIPTION, SHADER_SRC, EVAL_FUNC_BODY)                                  \
	do                                                                                                    \
	{                                                                                                     \
		struct Eval_##NAME                                                                                \
		{                                                                                                 \
			static void eval(ShaderEvalContext& c) EVAL_FUNC_BODY                                         \
		};                                                                                                \
		addChild(createStructCase(m_context, #NAME "_vertex", DESCRIPTION, m_glslVersion, true, false,    \
								  &Eval_##NAME::eval, DE_NULL, SHADER_SRC));                              \
		addChild(createStructCase(m_context, #NAME "_fragment", DESCRIPTION, m_glslVersion, false, false, \
								  &Eval_##NAME::eval, DE_NULL, SHADER_SRC));                              \
	} while (deGetFalse())

	LOCAL_STRUCT_CASE(basic, "Basic struct usage",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_one;"
								   << ""
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    mediump vec3    b;"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s = S(${COORDS}.x, vec3(0.0), ui_one);"
								   << "    s.b = ${COORDS}.yzw;"
								   << "    ${DST} = vec4(s.a, s.b.x, s.b.y, s.c);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(0, 1, 2); });

	LOCAL_STRUCT_CASE(nested, "Nested struct",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << ""
								   << "struct T {"
								   << "    int             a;"
								   << "    mediump vec2    b;"
								   << "};"
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    T               b;"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);"
								   << "    s.b = T(ui_zero, ${COORDS}.yz);"
								   << "    ${DST} = vec4(s.a, s.b.b, s.b.a + s.c);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(0, 1, 2); });

	LOCAL_STRUCT_CASE(array_member, "Struct with array member",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_one;"
								   << ""
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    mediump float   b[3];"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s;"
								   << "    s.a = ${COORDS}.w;"
								   << "    s.c = ui_one;"
								   << "    s.b[0] = ${COORDS}.z;"
								   << "    s.b[1] = ${COORDS}.y;"
								   << "    s.b[2] = ${COORDS}.x;"
								   << "    ${DST} = vec4(s.a, s.b[0], s.b[1], s.c);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(3, 2, 1); });

	LOCAL_STRUCT_CASE(array_member_dynamic_index, "Struct with array member, dynamic indexing",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << "uniform int ui_two;"
								   << ""
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    mediump float   b[3];"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s;"
								   << "    s.a = ${COORDS}.w;"
								   << "    s.c = ui_one;"
								   << "    s.b[0] = ${COORDS}.z;"
								   << "    s.b[1] = ${COORDS}.y;"
								   << "    s.b[2] = ${COORDS}.x;"
								   << "    ${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(1, 2, 0); });

	LOCAL_STRUCT_CASE(struct_array, "Struct array",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << "uniform int ui_two;"
								   << ""
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    mediump int     b;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s[3];"
								   << "    s[0] = S(${COORDS}.x, ui_zero);"
								   << "    s[1].a = ${COORDS}.y;"
								   << "    s[1].b = ui_one;"
								   << "    s[2] = S(${COORDS}.z, ui_two);"
								   << "    ${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(2, 1, 0); });

	LOCAL_STRUCT_CASE(
		struct_array_dynamic_index, "Struct array with dynamic indexing",
		LineStream()
			<< "${HEADER}"
			<< "uniform int ui_zero;"
			<< "uniform int ui_one;"
			<< "uniform int ui_two;"
			<< ""
			<< "struct S {"
			<< "    mediump float   a;"
			<< "    mediump int     b;"
			<< "};"
			<< ""
			<< "void main (void)"
			<< "{"
			<< "    S s[3];"
			<< "    s[0] = S(${COORDS}.x, ui_zero);"
			<< "    s[1].a = ${COORDS}.y;"
			<< "    s[1].b = ui_one;"
			<< "    s[2] = S(${COORDS}.z, ui_two);"
			<< "    ${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
			<< "    ${ASSIGN_POS}"
			<< "}",
		{ c.color.xyz() = c.coords.swizzle(2, 1, 0); });

	LOCAL_STRUCT_CASE(
		nested_struct_array, "Nested struct array",
		LineStream() << "${HEADER}"
					 << "uniform int ui_zero;"
					 << "uniform int ui_one;"
					 << "uniform int ui_two;"
					 << "uniform mediump float uf_two;"
					 << "uniform mediump float uf_three;"
					 << "uniform mediump float uf_four;"
					 << "uniform mediump float uf_half;"
					 << "uniform mediump float uf_third;"
					 << "uniform mediump float uf_fourth;"
					 << ""
					 << "struct T {"
					 << "    mediump float   a;"
					 << "    mediump vec2    b[2];"
					 << "};"
					 << "struct S {"
					 << "    mediump float   a;"
					 << "    T               b[3];"
					 << "    int             c;"
					 << "};"
					 << ""
					 << "void main (void)"
					 << "{"
					 << "    S s[2];"
					 << ""
					 << "    // S[0]"
					 << "    s[0].a         = ${COORDS}.x;"
					 << "    s[0].b[0].a    = uf_half;"
					 << "    s[0].b[0].b[0] = ${COORDS}.xy;"
					 << "    s[0].b[0].b[1] = ${COORDS}.zw;"
					 << "    s[0].b[1].a    = uf_third;"
					 << "    s[0].b[1].b[0] = ${COORDS}.zw;"
					 << "    s[0].b[1].b[1] = ${COORDS}.xy;"
					 << "    s[0].b[2].a    = uf_fourth;"
					 << "    s[0].b[2].b[0] = ${COORDS}.xz;"
					 << "    s[0].b[2].b[1] = ${COORDS}.yw;"
					 << "    s[0].c         = ui_zero;"
					 << ""
					 << "    // S[1]"
					 << "    s[1].a         = ${COORDS}.w;"
					 << "    s[1].b[0].a    = uf_two;"
					 << "    s[1].b[0].b[0] = ${COORDS}.xx;"
					 << "    s[1].b[0].b[1] = ${COORDS}.yy;"
					 << "    s[1].b[1].a    = uf_three;"
					 << "    s[1].b[1].b[0] = ${COORDS}.zz;"
					 << "    s[1].b[1].b[1] = ${COORDS}.ww;"
					 << "    s[1].b[2].a    = uf_four;"
					 << "    s[1].b[2].b[0] = ${COORDS}.yx;"
					 << "    s[1].b[2].b[1] = ${COORDS}.wz;"
					 << "    s[1].c         = ui_one;"
					 << ""
					 << "    mediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
					 << "    mediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
					 << "    mediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w "
						"+ w) * 0.333"
					 << "    mediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
					 << "    ${DST} = vec4(r, g, b, a);"
					 << "    ${ASSIGN_POS}"
					 << "}",
		{ c.color.xyz() = c.coords.swizzle(2, 0, 3); });

	LOCAL_STRUCT_CASE(nested_struct_array_dynamic_index, "Nested struct array with dynamic indexing",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << "uniform int ui_two;"
								   << "uniform mediump float uf_two;"
								   << "uniform mediump float uf_three;"
								   << "uniform mediump float uf_four;"
								   << "uniform mediump float uf_half;"
								   << "uniform mediump float uf_third;"
								   << "uniform mediump float uf_fourth;"
								   << ""
								   << "struct T {"
								   << "    mediump float   a;"
								   << "    mediump vec2    b[2];"
								   << "};"
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    T               b[3];"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s[2];"
								   << ""
								   << "    // S[0]"
								   << "    s[0].a         = ${COORDS}.x;"
								   << "    s[0].b[0].a    = uf_half;"
								   << "    s[0].b[0].b[0] = ${COORDS}.xy;"
								   << "    s[0].b[0].b[1] = ${COORDS}.zw;"
								   << "    s[0].b[1].a    = uf_third;"
								   << "    s[0].b[1].b[0] = ${COORDS}.zw;"
								   << "    s[0].b[1].b[1] = ${COORDS}.xy;"
								   << "    s[0].b[2].a    = uf_fourth;"
								   << "    s[0].b[2].b[0] = ${COORDS}.xz;"
								   << "    s[0].b[2].b[1] = ${COORDS}.yw;"
								   << "    s[0].c         = ui_zero;"
								   << ""
								   << "    // S[1]"
								   << "    s[1].a         = ${COORDS}.w;"
								   << "    s[1].b[0].a    = uf_two;"
								   << "    s[1].b[0].b[0] = ${COORDS}.xx;"
								   << "    s[1].b[0].b[1] = ${COORDS}.yy;"
								   << "    s[1].b[1].a    = uf_three;"
								   << "    s[1].b[1].b[0] = ${COORDS}.zz;"
								   << "    s[1].b[1].b[1] = ${COORDS}.ww;"
								   << "    s[1].b[2].a    = uf_four;"
								   << "    s[1].b[2].b[0] = ${COORDS}.yx;"
								   << "    s[1].b[2].b[1] = ${COORDS}.wz;"
								   << "    s[1].c         = ui_one;"
								   << ""
								   << "    mediump float r = (s[0].b[ui_one].b[ui_one-1].x + "
									  "s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
								   << "    mediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a * "
									  "s[ui_one].b[2].a; // x * 0.25 * 4"
								   << "    mediump float b = (s[ui_zero].b[ui_one+1].b[1].y + "
									  "s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w + "
									  "w + w) * 0.333"
								   << "    mediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - "
									  "s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
								   << "    ${DST} = vec4(r, g, b, a);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(2, 0, 3); });

	LOCAL_STRUCT_CASE(parameter, "Struct as a function parameter",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_one;"
								   << ""
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    mediump vec3    b;"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "mediump vec4 myFunc (S s)"
								   << "{"
								   << "    return vec4(s.a, s.b.x, s.b.y, s.c);"
								   << "}"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s = S(${COORDS}.x, vec3(0.0), ui_one);"
								   << "    s.b = ${COORDS}.yzw;"
								   << "    ${DST} = myFunc(s);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(0, 1, 2); });

	LOCAL_STRUCT_CASE(parameter_nested, "Nested struct as a function parameter",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << ""
								   << "struct T {"
								   << "    int             a;"
								   << "    mediump vec2    b;"
								   << "};"
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    T               b;"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "mediump vec4 myFunc (S s)"
								   << "{"
								   << "    return vec4(s.a, s.b.b, s.b.a + s.c);"
								   << "}"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);"
								   << "    s.b = T(ui_zero, ${COORDS}.yz);"
								   << "    ${DST} = myFunc(s);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(0, 1, 2); });

	LOCAL_STRUCT_CASE(return, "Struct as a return value",
							LineStream() << "${HEADER}"
										 << "uniform int ui_one;"
										 << ""
										 << "struct S {"
										 << "    mediump float   a;"
										 << "    mediump vec3    b;"
										 << "    int             c;"
										 << "};"
										 << ""
										 << "S myFunc (void)"
										 << "{"
										 << "    S s = S(${COORDS}.x, vec3(0.0), ui_one);"
										 << "    s.b = ${COORDS}.yzw;"
										 << "    return s;"
										 << "}"
										 << ""
										 << "void main (void)"
										 << "{"
										 << "    S s = myFunc();"
										 << "    ${DST} = vec4(s.a, s.b.x, s.b.y, s.c);"
										 << "    ${ASSIGN_POS}"
										 << "}",
							{ c.color.xyz() = c.coords.swizzle(0, 1, 2); });

	LOCAL_STRUCT_CASE(return_nested, "Nested struct",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << ""
								   << "struct T {"
								   << "    int             a;"
								   << "    mediump vec2    b;"
								   << "};"
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    T               b;"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "S myFunc (void)"
								   << "{"
								   << "    S s = S(${COORDS}.x, T(0, vec2(0.0)), ui_one);"
								   << "    s.b = T(ui_zero, ${COORDS}.yz);"
								   << "    return s;"
								   << "}"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s = myFunc();"
								   << "    ${DST} = vec4(s.a, s.b.b, s.b.a + s.c);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(0, 1, 2); });

	LOCAL_STRUCT_CASE(conditional_assignment, "Conditional struct assignment",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << "uniform mediump float uf_one;"
								   << ""
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    mediump vec3    b;"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);"
								   << "    if (uf_one > 0.0)"
								   << "        s = S(${COORDS}.w, ${COORDS}.zyx, ui_one);"
								   << "    ${DST} = vec4(s.a, s.b.xy, s.c);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(3, 2, 1); });

	LOCAL_STRUCT_CASE(loop_assignment, "Struct assignment in loop",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << ""
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    mediump vec3    b;"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);"
								   << "    for (int i = 0; i < 3; i++)"
								   << "    {"
								   << "        if (i == 1)"
								   << "            s = S(${COORDS}.w, ${COORDS}.zyx, ui_one);"
								   << "    }"
								   << "    ${DST} = vec4(s.a, s.b.xy, s.c);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(3, 2, 1); });

	LOCAL_STRUCT_CASE(dynamic_loop_assignment, "Struct assignment in loop",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << "uniform int ui_three;"
								   << ""
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    mediump vec3    b;"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s = S(${COORDS}.x, ${COORDS}.yzw, ui_zero);"
								   << "    for (int i = 0; i < ui_three; i++)"
								   << "    {"
								   << "        if (i == ui_one)"
								   << "            s = S(${COORDS}.w, ${COORDS}.zyx, ui_one);"
								   << "    }"
								   << "    ${DST} = vec4(s.a, s.b.xy, s.c);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(3, 2, 1); });

	LOCAL_STRUCT_CASE(nested_conditional_assignment, "Conditional assignment of nested struct",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << "uniform mediump float uf_one;"
								   << ""
								   << "struct T {"
								   << "    int             a;"
								   << "    mediump vec2    b;"
								   << "};"
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    T               b;"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);"
								   << "    if (uf_one > 0.0)"
								   << "        s.b = T(ui_zero, ${COORDS}.zw);"
								   << "    ${DST} = vec4(s.a, s.b.b, s.c - s.b.a);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(0, 2, 3); });

	LOCAL_STRUCT_CASE(nested_loop_assignment, "Nested struct assignment in loop",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << "uniform mediump float uf_one;"
								   << ""
								   << "struct T {"
								   << "    int             a;"
								   << "    mediump vec2    b;"
								   << "};"
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    T               b;"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);"
								   << "    for (int i = 0; i < 3; i++)"
								   << "    {"
								   << "        if (i == 1)"
								   << "            s.b = T(ui_zero, ${COORDS}.zw);"
								   << "    }"
								   << "    ${DST} = vec4(s.a, s.b.b, s.c - s.b.a);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(0, 2, 3); });

	LOCAL_STRUCT_CASE(nested_dynamic_loop_assignment, "Nested struct assignment in dynamic loop",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << "uniform int ui_three;"
								   << "uniform mediump float uf_one;"
								   << ""
								   << "struct T {"
								   << "    int             a;"
								   << "    mediump vec2    b;"
								   << "};"
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    T               b;"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s = S(${COORDS}.x, T(ui_one, ${COORDS}.yz), ui_one);"
								   << "    for (int i = 0; i < ui_three; i++)"
								   << "    {"
								   << "        if (i == ui_one)"
								   << "            s.b = T(ui_zero, ${COORDS}.zw);"
								   << "    }"
								   << "    ${DST} = vec4(s.a, s.b.b, s.c - s.b.a);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(0, 2, 3); });

	LOCAL_STRUCT_CASE(loop_struct_array, "Struct array usage in loop",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << "uniform int ui_two;"
								   << ""
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    mediump int     b;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s[3];"
								   << "    s[0] = S(${COORDS}.x, ui_zero);"
								   << "    s[1].a = ${COORDS}.y;"
								   << "    s[1].b = -ui_one;"
								   << "    s[2] = S(${COORDS}.z, ui_two);"
								   << ""
								   << "    mediump float rgb[3];"
								   << "    int alpha = 0;"
								   << "    for (int i = 0; i < 3; i++)"
								   << "    {"
								   << "        rgb[i] = s[2-i].a;"
								   << "        alpha += s[i].b;"
								   << "    }"
								   << "    ${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(2, 1, 0); });

	LOCAL_STRUCT_CASE(loop_nested_struct_array, "Nested struct array usage in loop",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << "uniform int ui_two;"
								   << "uniform mediump float uf_two;"
								   << "uniform mediump float uf_three;"
								   << "uniform mediump float uf_four;"
								   << "uniform mediump float uf_half;"
								   << "uniform mediump float uf_third;"
								   << "uniform mediump float uf_fourth;"
								   << "uniform mediump float uf_sixth;"
								   << ""
								   << "struct T {"
								   << "    mediump float   a;"
								   << "    mediump vec2    b[2];"
								   << "};"
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    T               b[3];"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s[2];"
								   << ""
								   << "    // S[0]"
								   << "    s[0].a         = ${COORDS}.x;"
								   << "    s[0].b[0].a    = uf_half;"
								   << "    s[0].b[0].b[0] = ${COORDS}.yx;"
								   << "    s[0].b[0].b[1] = ${COORDS}.zx;"
								   << "    s[0].b[1].a    = uf_third;"
								   << "    s[0].b[1].b[0] = ${COORDS}.yy;"
								   << "    s[0].b[1].b[1] = ${COORDS}.wy;"
								   << "    s[0].b[2].a    = uf_fourth;"
								   << "    s[0].b[2].b[0] = ${COORDS}.zx;"
								   << "    s[0].b[2].b[1] = ${COORDS}.zy;"
								   << "    s[0].c         = ui_zero;"
								   << ""
								   << "    // S[1]"
								   << "    s[1].a         = ${COORDS}.w;"
								   << "    s[1].b[0].a    = uf_two;"
								   << "    s[1].b[0].b[0] = ${COORDS}.zx;"
								   << "    s[1].b[0].b[1] = ${COORDS}.zy;"
								   << "    s[1].b[1].a    = uf_three;"
								   << "    s[1].b[1].b[0] = ${COORDS}.zz;"
								   << "    s[1].b[1].b[1] = ${COORDS}.ww;"
								   << "    s[1].b[2].a    = uf_four;"
								   << "    s[1].b[2].b[0] = ${COORDS}.yx;"
								   << "    s[1].b[2].b[1] = ${COORDS}.wz;"
								   << "    s[1].c         = ui_one;"
								   << ""
								   << "    mediump float r = 0.0; // (x*3 + y*3) / 6.0"
								   << "    mediump float g = 0.0; // (y*3 + z*3) / 6.0"
								   << "    mediump float b = 0.0; // (z*3 + w*3) / 6.0"
								   << "    mediump float a = 1.0;"
								   << "    for (int i = 0; i < 2; i++)"
								   << "    {"
								   << "        for (int j = 0; j < 3; j++)"
								   << "        {"
								   << "            r += s[0].b[j].b[i].y;"
								   << "            g += s[i].b[j].b[0].x;"
								   << "            b += s[i].b[j].b[1].x;"
								   << "            a *= s[i].b[j].a;"
								   << "        }"
								   << "    }"
								   << "    ${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = (c.coords.swizzle(0, 1, 2) + c.coords.swizzle(1, 2, 3)) * 0.5f; });

	LOCAL_STRUCT_CASE(dynamic_loop_struct_array, "Struct array usage in dynamic loop",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << "uniform int ui_two;"
								   << "uniform int ui_three;"
								   << ""
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    mediump int     b;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s[3];"
								   << "    s[0] = S(${COORDS}.x, ui_zero);"
								   << "    s[1].a = ${COORDS}.y;"
								   << "    s[1].b = -ui_one;"
								   << "    s[2] = S(${COORDS}.z, ui_two);"
								   << ""
								   << "    mediump float rgb[3];"
								   << "    int alpha = 0;"
								   << "    for (int i = 0; i < ui_three; i++)"
								   << "    {"
								   << "        rgb[i] = s[2-i].a;"
								   << "        alpha += s[i].b;"
								   << "    }"
								   << "    ${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = c.coords.swizzle(2, 1, 0); });

	LOCAL_STRUCT_CASE(dynamic_loop_nested_struct_array, "Nested struct array usage in dynamic loop",
					  LineStream() << "${HEADER}"
								   << "uniform int ui_zero;"
								   << "uniform int ui_one;"
								   << "uniform int ui_two;"
								   << "uniform int ui_three;"
								   << "uniform mediump float uf_two;"
								   << "uniform mediump float uf_three;"
								   << "uniform mediump float uf_four;"
								   << "uniform mediump float uf_half;"
								   << "uniform mediump float uf_third;"
								   << "uniform mediump float uf_fourth;"
								   << "uniform mediump float uf_sixth;"
								   << ""
								   << "struct T {"
								   << "    mediump float   a;"
								   << "    mediump vec2    b[2];"
								   << "};"
								   << "struct S {"
								   << "    mediump float   a;"
								   << "    T               b[3];"
								   << "    int             c;"
								   << "};"
								   << ""
								   << "void main (void)"
								   << "{"
								   << "    S s[2];"
								   << ""
								   << "    // S[0]"
								   << "    s[0].a         = ${COORDS}.x;"
								   << "    s[0].b[0].a    = uf_half;"
								   << "    s[0].b[0].b[0] = ${COORDS}.yx;"
								   << "    s[0].b[0].b[1] = ${COORDS}.zx;"
								   << "    s[0].b[1].a    = uf_third;"
								   << "    s[0].b[1].b[0] = ${COORDS}.yy;"
								   << "    s[0].b[1].b[1] = ${COORDS}.wy;"
								   << "    s[0].b[2].a    = uf_fourth;"
								   << "    s[0].b[2].b[0] = ${COORDS}.zx;"
								   << "    s[0].b[2].b[1] = ${COORDS}.zy;"
								   << "    s[0].c         = ui_zero;"
								   << ""
								   << "    // S[1]"
								   << "    s[1].a         = ${COORDS}.w;"
								   << "    s[1].b[0].a    = uf_two;"
								   << "    s[1].b[0].b[0] = ${COORDS}.zx;"
								   << "    s[1].b[0].b[1] = ${COORDS}.zy;"
								   << "    s[1].b[1].a    = uf_three;"
								   << "    s[1].b[1].b[0] = ${COORDS}.zz;"
								   << "    s[1].b[1].b[1] = ${COORDS}.ww;"
								   << "    s[1].b[2].a    = uf_four;"
								   << "    s[1].b[2].b[0] = ${COORDS}.yx;"
								   << "    s[1].b[2].b[1] = ${COORDS}.wz;"
								   << "    s[1].c         = ui_one;"
								   << ""
								   << "    mediump float r = 0.0; // (x*3 + y*3) / 6.0"
								   << "    mediump float g = 0.0; // (y*3 + z*3) / 6.0"
								   << "    mediump float b = 0.0; // (z*3 + w*3) / 6.0"
								   << "    mediump float a = 1.0;"
								   << "    for (int i = 0; i < ui_two; i++)"
								   << "    {"
								   << "        for (int j = 0; j < ui_three; j++)"
								   << "        {"
								   << "            r += s[0].b[j].b[i].y;"
								   << "            g += s[i].b[j].b[0].x;"
								   << "            b += s[i].b[j].b[1].x;"
								   << "            a *= s[i].b[j].a;"
								   << "        }"
								   << "    }"
								   << "    ${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);"
								   << "    ${ASSIGN_POS}"
								   << "}",
					  { c.color.xyz() = (c.coords.swizzle(0, 1, 2) + c.coords.swizzle(1, 2, 3)) * 0.5f; });
}